

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_791d::VECTOR_DIM_DIM_1_Test::TestBody(VECTOR_DIM_DIM_1_Test *this)

{
  bool bVar1;
  char *pcVar2;
  initializer_list<int> __l;
  AssertionResult gtest_ar;
  type v;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertHelper local_48;
  undefined1 *local_40;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  vector<int,_std::allocator<int>_> local_30;
  
  local_40 = &DAT_200000001;
  local_38.ptr_._0_4_ = 3;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_40;
  std::vector<int,_std::allocator<int>_>::vector(&local_30,__l,(allocator_type *)&local_50);
  local_50.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish -
        (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start >> 2);
  local_48.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_40,"v.size()","3",(unsigned_long *)&local_50,(int *)&local_48);
  if (local_40._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if ((undefined8 *)CONCAT44(local_38.ptr_._4_4_,local_38.ptr_._0_4_) == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)CONCAT44(local_38.ptr_._4_4_,local_38.ptr_._0_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x15,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_50.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_50.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_50.ptr_._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_40,"v[1]","2",
             local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start + 1,(int *)&local_50);
  if (local_40._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if ((undefined8 *)CONCAT44(local_38.ptr_._4_4_,local_38.ptr_._0_4_) == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)CONCAT44(local_38.ptr_._4_4_,local_38.ptr_._0_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x16,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_50.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_50.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(VECTOR_DIM, DIM_1) {
        vector_dim<int, 1>::type v = {1,2,3};
        EXPECT_EQ(v.size(), 3);
        EXPECT_EQ(v[1], 2);
    }